

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

void Bmc_CexPrint(Abc_Cex_t *pCex,int nRealPis,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int local_28;
  uint local_24;
  int iBit;
  int Count;
  int k;
  int i;
  int fVerbose_local;
  int nRealPis_local;
  Abc_Cex_t *pCex_local;
  
  local_28 = pCex->nRegs;
  Abc_CexPrintStatsInputs(pCex,nRealPis);
  if (fVerbose != 0) {
    for (Count = 0; Count <= pCex->iFrame; Count = Count + 1) {
      local_24 = 0;
      printf("%3d : ",(ulong)(uint)Count);
      for (iBit = 0; iBit < nRealPis; iBit = iBit + 1) {
        iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),local_28);
        local_24 = iVar1 + local_24;
        uVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_28);
        printf("%d",(ulong)uVar2);
        local_28 = local_28 + 1;
      }
      printf(" %3d ",(ulong)local_24);
      local_24 = 0;
      for (; iBit < pCex->nPis; iBit = iBit + 1) {
        iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),local_28);
        local_24 = iVar1 + local_24;
        uVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_28);
        printf("%d",(ulong)uVar2);
        local_28 = local_28 + 1;
      }
      printf(" %3d\n",(ulong)local_24);
    }
    if (local_28 != pCex->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                    ,0x14c,"void Bmc_CexPrint(Abc_Cex_t *, int, int)");
    }
  }
  return;
}

Assistant:

void Bmc_CexPrint( Abc_Cex_t * pCex, int nRealPis, int fVerbose )
{
    int i, k, Count, iBit = pCex->nRegs;
    Abc_CexPrintStatsInputs( pCex, nRealPis );
    if ( !fVerbose )
        return;

    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Count = 0;
        printf( "%3d : ", i );
        for ( k = 0; k < nRealPis; k++ )
        {
            Count += Abc_InfoHasBit(pCex->pData, iBit);
            printf( "%d", Abc_InfoHasBit(pCex->pData, iBit++) );
        }
        printf( " %3d ", Count );
        Count = 0;
        for (      ; k < pCex->nPis; k++ )
        {
            Count += Abc_InfoHasBit(pCex->pData, iBit);
            printf( "%d", Abc_InfoHasBit(pCex->pData, iBit++) );
        }
        printf( " %3d\n", Count );
    }
    assert( iBit == pCex->nBits );
}